

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Performance::anon_unknown_1::MapBufferRangeCase::init
          (MapBufferRangeCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  int iVar1;
  char *pcVar2;
  EVP_PKEY_CTX *ctx_00;
  MessageBuilder local_198;
  
  local_198.m_log =
       ((this->
        super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
        ).
        super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
        .super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = &local_198.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,
                  "Testing glMapBufferRange() and glUnmapBuffer() function call performance.\n");
  pcVar2 = "Half of the buffer is mapped.";
  if (this->m_fullUpload != false) {
    pcVar2 = "The whole buffer is mapped.";
  }
  std::operator<<((ostream *)this_00,pcVar2);
  std::operator<<((ostream *)this_00,"\n");
  pcVar2 = 
  "The buffer has not been used before mapping and is allocated with unspecified contents.\n";
  if (this->m_useUnusedUnspecifiedBuffer == false) {
    pcVar2 = "";
  }
  std::operator<<((ostream *)this_00,pcVar2);
  pcVar2 = "The buffer has not been used before mapping and is allocated with specified contents.\n"
  ;
  if (this->m_useUnusedSpecifiedBuffer == false) {
    pcVar2 = "";
  }
  std::operator<<((ostream *)this_00,pcVar2);
  pcVar2 = "The buffer has previously been used in a drawing operation.\n";
  if (((this->m_useUnusedUnspecifiedBuffer | this->m_useUnusedSpecifiedBuffer) & 1U) != 0) {
    pcVar2 = "";
  }
  std::operator<<((ostream *)this_00,pcVar2);
  pcVar2 = "The buffer is cleared with glBufferData(..., NULL) before mapping.\n";
  if (this->m_manualInvalidation == false) {
    pcVar2 = "";
  }
  std::operator<<((ostream *)this_00,pcVar2);
  std::operator<<((ostream *)this_00,"Map bits:\n");
  pcVar2 = "\tGL_MAP_WRITE_BIT\n";
  if ((this->m_mapFlags & 2) == 0) {
    pcVar2 = "";
  }
  std::operator<<((ostream *)this_00,pcVar2);
  pcVar2 = "\tGL_MAP_READ_BIT\n";
  if ((this->m_mapFlags & 1) == 0) {
    pcVar2 = "";
  }
  std::operator<<((ostream *)this_00,pcVar2);
  pcVar2 = "\tGL_MAP_INVALIDATE_RANGE_BIT\n";
  if ((this->m_mapFlags & 4) == 0) {
    pcVar2 = "";
  }
  std::operator<<((ostream *)this_00,pcVar2);
  pcVar2 = "\tGL_MAP_INVALIDATE_BUFFER_BIT\n";
  if ((this->m_mapFlags & 8) == 0) {
    pcVar2 = "";
  }
  std::operator<<((ostream *)this_00,pcVar2);
  pcVar2 = "\tGL_MAP_UNSYNCHRONIZED_BIT\n";
  if ((this->m_mapFlags & 0x20) == 0) {
    pcVar2 = "";
  }
  std::operator<<((ostream *)this_00,pcVar2);
  ctx_00 = (EVP_PKEY_CTX *)&tcu::TestLog::EndMessage;
  tcu::MessageBuilder::operator<<(&local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  iVar1 = BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>::
          init(&this->
                super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
               ,ctx_00);
  return iVar1;
}

Assistant:

void MapBufferRangeCase::init (void)
{
	// Describe what the test tries to do
	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Testing glMapBufferRange() and glUnmapBuffer() function call performance.\n"
		<< ((m_fullUpload) ? ("The whole buffer is mapped.") : ("Half of the buffer is mapped.")) << "\n"
		<< ((m_useUnusedUnspecifiedBuffer) ? ("The buffer has not been used before mapping and is allocated with unspecified contents.\n") : (""))
		<< ((m_useUnusedSpecifiedBuffer) ? ("The buffer has not been used before mapping and is allocated with specified contents.\n") : (""))
		<< ((!m_useUnusedSpecifiedBuffer && !m_useUnusedUnspecifiedBuffer) ? ("The buffer has previously been used in a drawing operation.\n") : (""))
		<< ((m_manualInvalidation) ? ("The buffer is cleared with glBufferData(..., NULL) before mapping.\n") : (""))
		<< "Map bits:\n"
		<< ((m_mapFlags & GL_MAP_WRITE_BIT) ? ("\tGL_MAP_WRITE_BIT\n") : (""))
		<< ((m_mapFlags & GL_MAP_READ_BIT) ? ("\tGL_MAP_READ_BIT\n") : (""))
		<< ((m_mapFlags & GL_MAP_INVALIDATE_RANGE_BIT) ? ("\tGL_MAP_INVALIDATE_RANGE_BIT\n") : (""))
		<< ((m_mapFlags & GL_MAP_INVALIDATE_BUFFER_BIT) ? ("\tGL_MAP_INVALIDATE_BUFFER_BIT\n") : (""))
		<< ((m_mapFlags & GL_MAP_UNSYNCHRONIZED_BIT) ? ("\tGL_MAP_UNSYNCHRONIZED_BIT\n") : (""))
		<< tcu::TestLog::EndMessage;

	BasicUploadCase<MapBufferRangeDuration>::init();
}